

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

DdManager * Llb4_Nonlin4SweepBadStates(Aig_Man_t *pAig,Vec_Int_t *vOrder,int nVars)

{
  Vec_Int_t *vVars2Q_00;
  DdManager *dd_00;
  Vec_Ptr_t *vParts_00;
  DdNode *n;
  DdNode *n_00;
  DdNode *bImage;
  DdNode *bMonitor;
  Vec_Int_t *vVars2Q;
  Vec_Ptr_t *vParts;
  DdManager *dd;
  int nVars_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  
  vVars2Q_00 = Llb_Nonlin4SweepVars2Q(pAig,vOrder,0);
  dd_00 = Cudd_Init(nVars,0,0x100,0x40000,0);
  vParts_00 = Llb_Nonlin4SweepPartitions(dd_00,pAig,vOrder,0);
  n = Llb4_Nonlin4SweepBadMonitor(pAig,vOrder,dd_00);
  Cudd_Ref(n);
  Cudd_AutodynEnable(dd_00,CUDD_REORDER_SYMM_SIFT);
  n_00 = Llb_Nonlin4Image(dd_00,vParts_00,n,vVars2Q_00);
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(dd_00,n);
  Llb_Nonlin4SweepDeref(dd_00,vParts_00);
  Vec_IntFree(vVars2Q_00);
  dd_00->bFunc = n_00;
  return dd_00;
}

Assistant:

DdManager * Llb4_Nonlin4SweepBadStates( Aig_Man_t * pAig, Vec_Int_t * vOrder, int nVars )
{
    DdManager * dd;
    Vec_Ptr_t * vParts;
    Vec_Int_t * vVars2Q;
    DdNode * bMonitor, * bImage;
    // get quantifiable variables
    vVars2Q = Llb_Nonlin4SweepVars2Q( pAig, vOrder, 0 );
    // start BDD manager and create partitions 
    dd = Cudd_Init( nVars, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    vParts = Llb_Nonlin4SweepPartitions( dd, pAig, vOrder, 0 );
//printf( "Outputs: " );
//Llb_Nonlin4SweepPrint( vParts );
    // compute image of the partitions
    bMonitor = Llb4_Nonlin4SweepBadMonitor( pAig, vOrder, dd );  Cudd_Ref( bMonitor );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    bImage = Llb_Nonlin4Image( dd, vParts, bMonitor, vVars2Q );  Cudd_Ref( bImage );
    Cudd_RecursiveDeref( dd, bMonitor );
    Llb_Nonlin4SweepDeref( dd, vParts );
    Vec_IntFree( vVars2Q );
    // save image and return
    dd->bFunc = bImage;
    return dd;
}